

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

Result * CoreML::validateInt8Requirements
                   (Result *__return_storage_ptr__,WeightParams *weights,string *layerType,
                   string *layerName)

{
  WeightParamType WVar1;
  undefined1 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  WVar1 = valueType(weights);
  if (WVar1 == QINT) {
    puVar2 = (undefined1 *)weights->quantization_;
    if ((QuantizationParams *)puVar2 == (QuantizationParams *)0x0) {
      puVar2 = Specification::_QuantizationParams_default_instance_;
    }
    if (((QuantizationParams *)puVar2)->numberofbits_ == 8) {
      if (((QuantizationParams *)puVar2)->_oneof_case_[0] == 0x65) {
        if ((((((QuantizationParams *)puVar2)->QuantizationType_).linearquantization_)->scale_).
            current_size_ == 1) {
          if ((((((QuantizationParams *)puVar2)->QuantizationType_).linearquantization_)->bias_).
              current_size_ == 0) {
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          std::operator+(&local_40,"Layer \'",layerName);
          std::operator+(&local_a0,&local_40,"\' of type \'");
          std::operator+(&local_80,&local_a0,layerType);
          std::operator+(&local_60,&local_80,
                         " :                           Linear quantization bias must be empty when flag \'int8DynamicQuantize\' is set to true."
                        );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
        }
        else {
          std::operator+(&local_40,"Layer \'",layerName);
          std::operator+(&local_a0,&local_40,"\' of type \'");
          std::operator+(&local_80,&local_a0,layerType);
          std::operator+(&local_60,&local_80,
                         " :                           Linear quantization scale must be size 1 when flag \'int8DynamicQuantize\' is set to true."
                        );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
        }
      }
      else {
        std::operator+(&local_40,"Layer \'",layerName);
        std::operator+(&local_a0,&local_40,"\' of type \'");
        std::operator+(&local_80,&local_a0,layerType);
        std::operator+(&local_60,&local_80,
                       " :                           Linear quantization must be used when flag \'int8DynamicQuantize\' is set to true."
                      );
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
      }
    }
    else {
      std::operator+(&local_40,"Layer \'",layerName);
      std::operator+(&local_a0,&local_40,"\' of type \'");
      std::operator+(&local_80,&local_a0,layerType);
      std::operator+(&local_60,&local_80,
                     " :                           Number of bits must equal 8 when flag \'int8DynamicQuantize\' is set to true."
                    );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
    }
  }
  else {
    std::operator+(&local_40,"Layer \'",layerName);
    std::operator+(&local_a0,&local_40,"\' of type \'");
    std::operator+(&local_80,&local_a0,layerType);
    std::operator+(&local_60,&local_80,
                   " :                            when flag \'int8DynamicQuantize\' is set to true, weights must be stored in the int8 format."
                  );
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInt8Requirements(const Specification::WeightParams& weights,
                                           const std::string &layerType,
                                           const std::string &layerName) {
        if (CoreML::valueType(weights) != CoreML::QINT) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " :  \
                          when flag 'int8DynamicQuantize' is set to true, weights must be stored in the int8 format.");
        }

        if (weights.quantization().numberofbits() != 8) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Number of bits must equal 8 when flag 'int8DynamicQuantize' is set to true.");
        } else if (!weights.quantization().has_linearquantization()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization must be used when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().scale_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization scale must be size 1 when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().bias_size() != 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization bias must be empty when flag 'int8DynamicQuantize' is set to true.");
        } else {
            return Result();
        }

    }